

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::MessageDifferencerTest_RepeatedFieldMapTest_IgnoredKeyFields_Test
::MessageDifferencerTest_RepeatedFieldMapTest_IgnoredKeyFields_Test
          (MessageDifferencerTest_RepeatedFieldMapTest_IgnoredKeyFields_Test *this)

{
  MessageDifferencerTest_RepeatedFieldMapTest_IgnoredKeyFields_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test =
       (_func_int **)
       &PTR__MessageDifferencerTest_RepeatedFieldMapTest_IgnoredKeyFields_Test_02a244a8;
  return;
}

Assistant:

TEST(MessageDifferencerTest, RepeatedFieldMapTest_IgnoredKeyFields) {
  proto2_unittest::TestDiffMessage msg1;
  proto2_unittest::TestDiffMessage msg2;
  // Treat "item" as Map, with key = ("a", "ra")
  proto2_unittest::TestDiffMessage::Item* item = msg1.add_item();
  item->set_a(1);
  item->add_ra(2);
  item->set_b("hello");
  item = msg2.add_item();
  item->set_a(1);
  item->add_ra(3);
  item->set_b("world");
  // Compare
  util::MessageDifferencer differencer;
  std::vector<const FieldDescriptor*> key_fields;
  key_fields.push_back(GetFieldDescriptor(msg1, "item.a"));
  key_fields.push_back(GetFieldDescriptor(msg1, "item.ra"));
  differencer.TreatAsMapWithMultipleFieldsAsKey(
      GetFieldDescriptor(msg1, "item"), key_fields);
  std::string output;
  differencer.ReportDifferencesToString(&output);
  EXPECT_FALSE(differencer.Compare(msg1, msg2));
  EXPECT_EQ(
      "added: item[0]: { a: 1 ra: 3 b: \"world\" }\n"
      "deleted: item[0]: { a: 1 ra: 2 b: \"hello\" }\n",
      output);
  // Ignored fields that are listed as parts of the key are still used
  // in key comparison, but they're not used in value comparison.
  differencer.IgnoreField(GetFieldDescriptor(msg1, "item.ra"));
  output.clear();
  EXPECT_FALSE(differencer.Compare(msg1, msg2));
  EXPECT_EQ(
      "added: item[0]: { a: 1 ra: 3 b: \"world\" }\n"
      "deleted: item[0]: { a: 1 ra: 2 b: \"hello\" }\n",
      output);
  // Ignoring a field in the key is different from treating the left fields
  // as key. That is:
  //   (key = ("a", "ra") && ignore "ra") != (key = ("a") && ignore "ra")
  util::MessageDifferencer differencer2;
  differencer2.TreatAsMap(GetFieldDescriptor(msg1, "item"),
                          GetFieldDescriptor(msg1, "item.a"));
  differencer2.IgnoreField(GetFieldDescriptor(msg1, "item.ra"));
  output.clear();
  differencer2.ReportDifferencesToString(&output);
  EXPECT_FALSE(differencer2.Compare(msg1, msg2));
  EXPECT_EQ(
      "ignored: item[0].ra\n"
      "modified: item[0].b: \"hello\" -> \"world\"\n",
      output);
}